

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelDecode.cpp
# Opt level: O1

error<idx2::idx2_err_code> idx2::ParallelDecode(idx2_file *Idx2,params *P,buffer *OutBuf)

{
  brick_pool *Bp;
  cstr pcVar1;
  ulong uVar2;
  cstr pcVar3;
  char *__s;
  long *in_FS_OFFSET;
  error<idx2::mmap_err_code> eVar4;
  unique_lock<std::mutex> Lock;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelDecode_cpp:520:3)>
  __ScopeGuard__520;
  timer DecodeTimer;
  grid OutGrid;
  mmap_volume OutVolFile;
  timespec End;
  decode_data D;
  unique_lock<std::mutex> local_3a8;
  decode_data *local_398;
  char local_390;
  volume local_388;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelDecode_cpp:493:3)>
  local_358;
  timespec local_340;
  grid local_330;
  undefined1 local_318 [72];
  allocator *local_2d0;
  timespec local_2c8;
  undefined1 local_2b8 [136];
  undefined8 uStack_230;
  allocator *local_228;
  idx2_file *local_220;
  thread_pool local_218;
  __native_type local_118;
  __native_type _Stack_f0;
  __native_type local_c8;
  condition_variable local_a0 [48];
  long local_70;
  __atomic_base<unsigned_long> _Stack_68;
  __atomic_base<unsigned_long> _Stack_60;
  __atomic_base<unsigned_long> _Stack_58;
  __atomic_base<unsigned_long> local_50;
  __atomic_base<unsigned_long> _Stack_48;
  __atomic_base<long> _Stack_40;
  __atomic_base<long> _Stack_38;
  
  clock_gettime(1,&local_340);
  GetGrid(&local_330,Idx2,&P->DecodeExtent);
  if (Mallocator()::Instance == '\0') {
    ParallelDecode();
  }
  local_318._0_8_ = (byte *)0x0;
  local_318._8_8_ = 0;
  local_318._16_8_ = &Mallocator()::Instance;
  local_318._24_8_ = 0;
  local_318[0x20] = __Invalid__;
  if (Mallocator()::Instance == '\0') {
    ParallelDecode();
  }
  local_318._56_16_ = SUB6416(ZEXT864(0),0) << 0x40;
  local_2d0 = (allocator *)&Mallocator()::Instance;
  if (Mallocator()::Instance == '\0') {
    ParallelDecode();
  }
  local_388.Buffer.Data = (byte *)0x0;
  local_388.Buffer.Bytes = 0;
  local_388.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
  local_388.Dims = 0;
  local_388.Type = __Invalid__;
  local_358.Func.OutVolFile = (mmap_volume *)local_318;
  local_358.Dismissed = false;
  local_358.Func.P = P;
  if (P->OutMode == RegularGridMem) {
    local_388.Buffer.Alloc = OutBuf->Alloc;
    local_388.Buffer.Data = OutBuf->Data;
    local_388.Buffer.Bytes = OutBuf->Bytes;
    local_388.Dims = local_330.super_extent.Dims & 0x7fffffffffffffff;
    local_388.Type = Idx2->DType;
  }
  else if (P->OutMode == RegularGridFile) {
    local_2b8._0_8_ = *(undefined8 *)Idx2->Name;
    local_2b8._8_8_ = *(undefined8 *)(Idx2->Name + 8);
    local_2b8._16_8_ = *(undefined8 *)(Idx2->Name + 0x10);
    local_2b8._24_8_ = *(undefined8 *)(Idx2->Name + 0x18);
    local_2b8._32_8_ = *(undefined8 *)(Idx2->Name + 0x20);
    local_2b8._40_8_ = *(undefined8 *)(Idx2->Name + 0x28);
    local_2b8._48_8_ = *(undefined8 *)(Idx2->Name + 0x30);
    local_2b8._56_8_ = *(undefined8 *)(Idx2->Name + 0x38);
    uVar2 = (ulong)uStack_230 >> 0x28;
    local_2b8._64_8_ = *(undefined8 *)Idx2->Field;
    local_2b8._72_8_ = *(undefined8 *)(Idx2->Field + 8);
    local_2b8._80_8_ = *(undefined8 *)(Idx2->Field + 0x10);
    local_2b8._88_8_ = *(undefined8 *)(Idx2->Field + 0x18);
    local_2b8._96_8_ = *(undefined8 *)(Idx2->Field + 0x20);
    local_2b8._104_8_ = *(undefined8 *)(Idx2->Field + 0x28);
    local_2b8._112_8_ = *(undefined8 *)(Idx2->Field + 0x30);
    local_2b8._120_8_ = *(undefined8 *)(Idx2->Field + 0x38);
    local_2b8._128_8_ =
         (long)(local_330.super_extent.Dims << 0x16) >> 0xb & 0xffffffff00000000U |
         (ulong)(uint)((long)(local_330.super_extent.Dims << 0x2b) >> 0x2b);
    uStack_230._0_5_ = CONCAT14(Idx2->DType,(int)((long)(local_330.super_extent.Dims * 2) >> 0x2b));
    uStack_230 = CONCAT35((int3)uVar2,(undefined5)uStack_230);
    if (P->OutFile == (cstr)0x0) {
      pcVar1 = P->OutDir;
      pcVar3 = ToRawFileName((metadata *)local_2b8);
      __s = (char *)(*in_FS_OFFSET + -0xf80);
      snprintf(__s,0x400,"%s/%s-tolerance-%f.raw",pcVar1,pcVar3);
    }
    else {
      __s = (char *)(*in_FS_OFFSET + -0xf80);
      snprintf(__s,0x400,"%s/%s",P->OutDir,P->OutFile);
    }
    eVar4 = MapVolume(__s,(v3i *)(local_2b8 + 0x80),uStack_230._4_1_,(mmap_volume *)local_318,Write)
    ;
    printf("writing output volume to %s\n",__s,eVar4._8_8_);
  }
  local_2b8._64_8_ = (brick_volume *)0x0;
  local_2b8._72_8_ = (bucket_status *)0x0;
  local_2b8._80_8_ = 0;
  local_2b8._88_8_ = 0;
  local_2b8._32_8_ = 0;
  local_2b8._40_8_ = 0;
  local_2b8._48_8_ = (allocator *)0x0;
  local_2b8._56_8_ = (unsigned_long *)0x0;
  local_2b8._0_8_ = (allocator *)0x0;
  local_2b8._8_8_ = (unsigned_long *)0x0;
  local_2b8._16_8_ = (file_cache *)0x0;
  local_2b8._24_8_ = (bucket_status *)0x0;
  local_2b8._96_8_ = (allocator *)0x0;
  if (Mallocator()::Instance == '\0') {
    ParallelDecode();
  }
  if (Mallocator()::Instance == '\0') {
    ParallelDecode();
  }
  local_2b8._104_8_ = (byte *)0x0;
  local_2b8._112_8_ = 0;
  local_2b8._120_8_ = &Mallocator()::Instance;
  local_2b8._128_8_ = (anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
  uStack_230 = 0;
  local_228 = (allocator *)&Mallocator()::Instance;
  local_220 = (idx2_file *)0x0;
  BS::thread_pool::thread_pool(&local_218,0);
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  _Stack_f0.__data.__list.__prev = (__pthread_internal_list *)0x0;
  _Stack_f0.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_118.__data.__list.__next = (__pthread_internal_list *)0x0;
  _Stack_f0.__align = 0;
  _Stack_f0._8_8_ = 0;
  _Stack_f0._16_8_ = 0;
  local_118.__align = 0;
  local_118._8_8_ = 0;
  local_118._16_8_ = 0;
  local_118.__data.__list.__prev = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(local_a0);
  local_50._M_i = 0;
  _Stack_48._M_i = 0;
  _Stack_40._M_i = 0;
  _Stack_38._M_i = 0;
  local_70 = 0;
  _Stack_68._M_i = 0;
  _Stack_60._M_i = 0;
  _Stack_58._M_i = 0;
  local_398 = (decode_data *)local_2b8;
  local_390 = '\0';
  if (Mallocator()::Instance == '\0') {
    ParallelDecode();
  }
  Init((decode_data *)local_2b8,Idx2,(allocator *)&Mallocator()::Instance);
  TraverseFirstLevel(Idx2,P,(decode_data *)local_2b8,&local_330,(mmap_volume *)local_318,&local_388)
  ;
  local_3a8._M_device = (mutex_type *)&local_c8;
  local_3a8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_3a8);
  local_3a8._M_owns = true;
  while (local_70 != 0) {
    std::condition_variable::wait((unique_lock *)local_a0);
  }
  if (P->OutMode == HashMap) {
    Bp = (brick_pool *)(local_2b8 + 0x38);
    PrintStatistics(Bp);
    ComputeBrickResolution(Bp);
    WriteBricks(Bp,"bricks");
  }
  clock_gettime(1,&local_2c8);
  printf("total decode time   = %f\n",
         (double)(long)((double)(local_2c8.tv_sec - local_340.tv_sec) * 1000000000.0 +
                       (double)(local_2c8.tv_nsec - local_340.tv_nsec)) / 1000000000.0,
         (double)(local_2c8.tv_nsec - local_340.tv_nsec),0x41cdcd6500000000,0);
  printf("io time             = %f\n",(double)(long)_Stack_68._M_i / 1000000000.0);
  printf("data movement time  = %f\n",(double)(long)_Stack_48._M_i / 1000000000.0);
  printf("exp   bytes read    = %li\n",_Stack_60._M_i);
  printf("data  bytes read    = %li\n",_Stack_58._M_i);
  printf("total bytes read    = %li\n",_Stack_58._M_i + _Stack_60._M_i);
  printf("total bytes decoded = %li\n",local_50._M_i >> 3);
  printf("final size of brick hashmap = %li\n",local_2b8._80_8_);
  printf("number of significant blocks = %li\n",_Stack_40._M_i);
  printf("number of insignificant subbands = %li\n",_Stack_38._M_i);
  *(char **)(*in_FS_OFFSET + -0x400) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x222;
  std::unique_lock<std::mutex>::~unique_lock(&local_3a8);
  if (local_390 == '\0') {
    Dealloc(local_398);
  }
  std::condition_variable::~condition_variable(local_a0);
  BS::thread_pool::~thread_pool(&local_218);
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp:493:3)>
  ::~scope_guard(&local_358);
  return (error<idx2::idx2_err_code>)ZEXT816(0x1bd71d);
}

Assistant:

error<idx2_err_code>
ParallelDecode(const idx2_file& Idx2, const params& P, buffer* OutBuf)
{
  timer DecodeTimer;
  StartTimer(&DecodeTimer);
  // TODO: we should add a --effective-mask
  grid OutGrid = GetGrid(Idx2, P.DecodeExtent);
  // printf("output grid = " idx2_PrStrGrid "\n", idx2_PrGrid(OutGrid));
  mmap_volume OutVolFile;
  volume OutVolMem;
  idx2_CleanUp(if (P.OutMode == params::out_mode::RegularGridFile) { Unmap(&OutVolFile); });

  if (P.OutMode == params::out_mode::RegularGridFile)
  {
    metadata Met;
    memcpy(Met.Name, Idx2.Name, sizeof(Met.Name));
    memcpy(Met.Field, Idx2.Field, sizeof(Met.Field));
    Met.Dims3 = Dims(OutGrid);
    Met.DType = Idx2.DType;
    //  printf("zfp decode time = %f\n", DecodeTime_);
    cstr OutFile = P.OutFile
                     ? idx2_PrintScratch("%s/%s", P.OutDir, P.OutFile)
                     : idx2_PrintScratch(
                         "%s/%s-tolerance-%f.raw", P.OutDir, ToRawFileName(Met), P.DecodeTolerance);
    //    idx2_RAII(mmap_volume, OutVol, (void)OutVol, Unmap(&OutVol));
    MapVolume(OutFile, Met.Dims3, Met.DType, &OutVolFile, map_mode::Write);
    printf("writing output volume to %s\n", OutFile);
  }
  else if (P.OutMode == params::out_mode::RegularGridMem)
  {
    OutVolMem.Buffer = *OutBuf;
    SetDims(&OutVolMem, Dims(OutGrid));
    OutVolMem.Type = Idx2.DType;
  }

  const int BrickBytes = Prod(Idx2.BrickDimsExt3) * sizeof(f64);
  // for now the allocator seems not a bottleneck
  idx2_RAII(decode_data, D, Init(&D, &Idx2, &Mallocator()));

  TraverseFirstLevel(Idx2, P, &D, OutGrid, &OutVolFile, &OutVolMem);

  std::unique_lock<std::mutex> Lock(D.Mutex);
  D.AllTasksDone.wait(Lock, [&D]{ return D.NTasks == 0; });
  //stlab::pre_exit();

  if (P.OutMode == params::out_mode::HashMap)
  {
    PrintStatistics(&D.BrickPool);
    ComputeBrickResolution(&D.BrickPool);
    WriteBricks(&D.BrickPool, "bricks");
  }

  printf("total decode time   = %f\n", Seconds(ElapsedTime(&DecodeTimer)));
  printf("io time             = %f\n", Seconds(D.DecodeIOTime_.load()));
  printf("data movement time  = %f\n", Seconds(D.DataMovementTime_.load()));
  printf("exp   bytes read    = %" PRIi64 "\n", D.BytesExps_.load());
  printf("data  bytes read    = %" PRIi64 "\n", D.BytesData_.load());
  printf("total bytes read    = %" PRIi64 "\n", D.BytesExps_.load() + D.BytesData_.load());
  printf("total bytes decoded = %" PRIi64 "\n", D.BytesDecoded_.load() / 8);
  printf("final size of brick hashmap = %" PRIi64 "\n", Size(D.BrickPool.BrickTable));
  printf("number of significant blocks = %" PRIi64 "\n", D.NSignificantBlocks.load());
  printf("number of insignificant subbands = %" PRIi64 "\n", D.NInsignificantSubbands.load());

  return idx2_Error(err_code::NoError);
}